

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

bool console_getline(string *_cmd,CommandList *_commands,Sandbox *_sandbox)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ostream *poVar12;
  _Rb_tree_node_base *p_Var13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  size_t sVar16;
  ulong uVar17;
  pointer pCVar18;
  char *pcVar19;
  string *psVar20;
  MEVENT m;
  string local_c0;
  Sandbox *local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (uniforms == (Uniforms *)0x0) {
    uniforms = &_sandbox->uniforms;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,cmd_abi_cxx11_._M_dataplus._M_p,
             cmd_abi_cxx11_._M_dataplus._M_p + cmd_abi_cxx11_._M_string_length);
  suggest(&local_50,&local_70,&cmd_suggested_abi_cxx11_,_commands);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  console_refresh();
  uVar9 = wgetch(_stdscr);
  iVar10 = 0x430be8;
  sVar16 = 0;
  std::__cxx11::string::_M_replace
            (0x430be8,0,(char *)cmd_suggested_abi_cxx11_._M_string_length,0x30762e);
  if ((uVar9 == 0x154) || (uVar9 == 9)) {
    sVar16 = cmd_tab_counter + 1;
  }
  cmd_tab_counter = sVar16;
  if ((int)uVar9 < 0x148) {
    if ((int)uVar9 < 0x7f) {
      if (uVar9 == 9) goto switchD_001e1962_caseD_154;
      if (uVar9 == 10) goto switchD_001e1962_caseD_14f;
      if (uVar9 != 0x20) goto switchD_001e1962_caseD_14c;
switchD_001e18e9_caseD_101:
      std::__cxx11::string::append((char *)&cmd_abi_cxx11_);
    }
    else {
      switch(uVar9) {
      case 0x101:
        goto switchD_001e18e9_caseD_101;
      case 0x102:
        if (cmd_history_offset != 0 &&
            cmd_history_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            cmd_history_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          cmd_cursor_offset = 0;
          cmd_history_offset = cmd_history_offset - 1;
          if (cmd_history_offset != 0) goto LAB_001e1f51;
          std::__cxx11::string::operator=((string *)&cmd_abi_cxx11_,"");
        }
        break;
      case 0x103:
        uVar17 = (long)cmd_history_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)cmd_history_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (cmd_history_offset < uVar17 - 1) {
          cmd_history_offset = cmd_history_offset + 1;
        }
        cmd_cursor_offset = 0;
        if (cmd_history_offset < uVar17) {
LAB_001e1f51:
          cmd_cursor_offset = 0;
          psVar20 = &cmd_abi_cxx11_;
LAB_001e2138:
          std::__cxx11::string::_M_assign((string *)psVar20);
        }
        break;
      case 0x104:
        cmd_cursor_offset =
             cmd_cursor_offset + (cmd_cursor_offset < cmd_abi_cxx11_._M_string_length);
        break;
      case 0x105:
        bVar6 = cmd_cursor_offset != 0;
        sVar16 = cmd_cursor_offset - 1;
        cmd_cursor_offset = 0;
        if (bVar6) {
          cmd_cursor_offset = sVar16;
        }
        break;
      case 0x106:
        pcVar19 = "KEY_HOME";
        lVar11 = 8;
        goto LAB_001e1f73;
      case 0x108:
        pcVar19 = "KEY_F0";
        goto LAB_001e1f6e;
      default:
        if (uVar9 != 0x7f) goto switchD_001e1962_caseD_14c;
      case 0x107:
switchD_001e18e9_caseD_107:
        if (cmd_cursor_offset < cmd_abi_cxx11_._M_string_length) {
          uVar17 = ~cmd_cursor_offset + cmd_abi_cxx11_._M_string_length;
          if (cmd_cursor_offset == 0) {
            lVar11 = ~cmd_cursor_offset + cmd_abi_cxx11_._M_string_length;
            cmd_abi_cxx11_._M_string_length = uVar17;
            cmd_abi_cxx11_._M_dataplus._M_p[lVar11] = '\0';
          }
          else {
            std::__cxx11::string::_M_erase(0x430bc8,uVar17);
          }
        }
      }
    }
    goto LAB_001e1fa2;
  }
  switch(uVar9) {
  case 0x148:
    pcVar19 = "KEY_DL";
    goto LAB_001e1f6e;
  case 0x149:
    pcVar19 = "KEY_IL";
    goto LAB_001e1f6e;
  case 0x14a:
    goto switchD_001e18e9_caseD_107;
  case 0x14b:
    pcVar19 = "KEY_IC";
LAB_001e1f6e:
    lVar11 = 6;
LAB_001e1f73:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,lVar11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    goto LAB_001e1fa2;
  case 0x14c:
  case 0x151:
  case 0x152:
  case 0x155:
  case 0x156:
    goto switchD_001e1962_caseD_14c;
  case 0x14d:
    pcVar19 = "KEY_CLEAR";
    lVar11 = 9;
    goto LAB_001e1f73;
  case 0x14e:
    pcVar19 = "KEY_EOS";
    lVar11 = 7;
    goto LAB_001e1f73;
  case 0x14f:
  case 0x157:
switchD_001e1962_caseD_14f:
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    std::__cxx11::stringbuf::str((string *)(buffer_cout_abi_cxx11_ + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                               local_c0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    std::__cxx11::stringbuf::str((string *)(buffer_cerr_abi_cxx11_ + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                               local_c0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&cmd_history_abi_cxx11_,&cmd_abi_cxx11_);
    cmd_cursor_offset = 0;
    cmd_history_offset = 0;
    std::__cxx11::string::_M_assign((string *)_cmd);
    std::__cxx11::string::_M_replace(0x430bc8,0,(char *)cmd_abi_cxx11_._M_string_length,0x30762e);
    goto LAB_001e1fa7;
  case 0x150:
  case 0x153:
    out_offset_line = out_offset_line + 1;
    goto LAB_001e1e74;
  case 0x154:
switchD_001e1962_caseD_154:
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    std::__cxx11::stringbuf::str((string *)(buffer_cout_abi_cxx11_ + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                               local_c0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    std::__cxx11::stringbuf::str((string *)(buffer_cerr_abi_cxx11_ + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                               local_c0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (cmd_abi_cxx11_._M_string_length != 0) {
      lVar11 = std::__cxx11::string::find(-0x38,0x2c);
      if (lVar11 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Suggestions:\n",0xd);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,cmd_abi_cxx11_._M_dataplus._M_p,
                   cmd_abi_cxx11_._M_dataplus._M_p + cmd_abi_cxx11_._M_string_length);
        suggest(&local_c0,&local_90,&cmd_suggested_abi_cxx11_,_commands);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_c0._M_dataplus._M_p,
                   CONCAT44(local_c0._M_string_length._4_4_,(int)local_c0._M_string_length));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,
                          CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                                   local_c0.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((cmd_tab_counter < 2) || (cmd_suggested_abi_cxx11_._M_string_length == 0)) {
          psVar20 = &cmd_suggested_abi_cxx11_;
          goto LAB_001e2138;
        }
        std::__cxx11::string::_M_assign((string *)&cmd_abi_cxx11_);
        cmd_tab_counter = 0;
      }
      else {
        local_98 = (ulong)uVar9;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Use:",4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        pCVar18 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
            super__Vector_impl_data._M_finish != pCVar18) {
          lVar11 = 0;
          uVar17 = 0;
          local_a0 = _sandbox;
          do {
            bVar6 = vera::beginsWith(&cmd_abi_cxx11_,
                                     (string *)((long)&(pCVar18->trigger)._M_dataplus._M_p + lVar11)
                                    );
            if (bVar6) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"      ",6);
              lVar4 = std::cout;
              *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr +
                       *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr +
                            *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
              *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar4 + -0x18))
                   = 0x10;
              pCVar18 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   *(char **)((long)&(pCVar18->formula)._M_dataplus._M_p + lVar11),
                                   *(long *)((long)&(pCVar18->formula)._M_string_length + lVar11));
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"   ",3);
              pCVar18 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,*(char **)((long)&(pCVar18->description)._M_dataplus._M_p
                                                     + lVar11),
                                   *(long *)((long)&(pCVar18->description)._M_string_length + lVar11
                                            ));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              _sandbox = local_a0;
              std::ostream::put((char)poVar12);
              std::ostream::flush();
            }
            uVar17 = uVar17 + 1;
            pCVar18 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar11 = lVar11 + 0x88;
          } while (uVar17 < (ulong)(((long)(_commands->
                                           super__Vector_base<Command,_std::allocator<Command>_>).
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pCVar18
                                    >> 3) * -0xf0f0f0f0f0f0f0f));
        }
        for (p_Var13 = (_sandbox->uniforms).data._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
            (_Rb_tree_header *)p_Var13 !=
            &(_sandbox->uniforms).data._M_t._M_impl.super__Rb_tree_header;
            p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
          bVar6 = vera::beginsWith(&cmd_abi_cxx11_,(string *)(p_Var13 + 1));
          if (bVar6) {
            pcVar19 = *(char **)(p_Var13 + 1);
            p_Var15 = p_Var13[1]._M_parent;
            while (std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,pcVar19,(long)p_Var15),
                  *(long *)(p_Var13 + 5) != 0) {
              p_Var15 = (_Base_ptr)0x8;
              pcVar19 = ",<value>";
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
            std::ostream::put(-0x28);
            std::ostream::flush();
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nNotes:",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "      - <values> between <...> brakets need to be change for and actual value",
                   0x4d);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "      - when words are separated by | you must choose one of the options, like: A|B|C"
                   ,0x55);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"      * everything betwee [...] is optative",0x2b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        uVar9 = (uint)local_98;
      }
    }
    goto LAB_001e1fa2;
  default:
    if (uVar9 == 0x19a) {
      console_sigwinch_handler(iVar10);
      goto LAB_001e1fa2;
    }
switchD_001e1962_caseD_14c:
    if (uVar9 - 0x151 < 2) {
      out_offset_line = out_offset_line + -1;
LAB_001e1e74:
      refresh_out_win();
      goto LAB_001e1fa2;
    }
  }
  switch(uVar9) {
  case 0x155:
    pcVar19 = "KEY_CTAB";
    break;
  default:
    std::__cxx11::string::_M_replace_aux
              (0x430bc8,cmd_abi_cxx11_._M_string_length - cmd_cursor_offset,0,'\x01');
    goto LAB_001e1fa2;
  case 0x158:
    pcVar19 = "KEY_SRESET";
    goto LAB_001e241d;
  case 0x159:
    pcVar19 = "KEY_RESET";
    goto LAB_001e23bb;
  case 0x15a:
    pcVar19 = "KEY_PRINT";
    goto LAB_001e23bb;
  case 0x15b:
    pcVar19 = "KEY_LL";
    goto LAB_001e23f3;
  case 0x15c:
    pcVar19 = "KEY_A1";
    goto LAB_001e23f3;
  case 0x15d:
    pcVar19 = "KEY_A3";
    goto LAB_001e23f3;
  case 0x15e:
    pcVar19 = "KEY_B2";
    goto LAB_001e23f3;
  case 0x15f:
    pcVar19 = "KEY_C1";
    goto LAB_001e23f3;
  case 0x160:
    pcVar19 = "KEY_C3";
LAB_001e23f3:
    lVar11 = 6;
    goto LAB_001e245c;
  case 0x161:
    pcVar19 = "KEY_BTAB";
    break;
  case 0x162:
    pcVar19 = "KEY_BEG";
    goto LAB_001e2408;
  case 0x163:
    pcVar19 = "KEY_CANCEL";
    goto LAB_001e241d;
  case 0x164:
    pcVar19 = "KEY_CLOSE";
    goto LAB_001e23bb;
  case 0x165:
    pcVar19 = "KEY_COMMAND";
    goto LAB_001e2442;
  case 0x166:
    pcVar19 = "KEY_COPY";
    break;
  case 0x167:
    pcVar19 = "KEY_CREATE";
    goto LAB_001e241d;
  case 0x168:
    pcVar19 = "KEY_END";
LAB_001e2408:
    lVar11 = 7;
    goto LAB_001e245c;
  case 0x169:
    pcVar19 = "KEY_EXIT";
    break;
  case 0x16a:
    pcVar19 = "KEY_FIND";
    break;
  case 0x16b:
    pcVar19 = "KEY_HELP";
    break;
  case 0x16c:
    pcVar19 = "KEY_MARK";
    break;
  case 0x16d:
    pcVar19 = "KEY_MESSAGE";
    goto LAB_001e2442;
  case 0x16e:
    pcVar19 = "KEY_MOVE";
    break;
  case 0x16f:
    pcVar19 = "KEY_NEXT";
    break;
  case 0x170:
    pcVar19 = "KEY_OPEN";
    break;
  case 0x173:
    pcVar19 = "KEY_REDO";
    break;
  case 0x175:
    pcVar19 = "KEY_REFRESH";
LAB_001e2442:
    lVar11 = 0xb;
    goto LAB_001e245c;
  case 0x178:
    pcVar19 = "KEY_RESUME";
    goto LAB_001e241d;
  case 0x189:
    pcVar19 = "KEY_SLEFT";
LAB_001e23bb:
    lVar11 = 9;
    goto LAB_001e245c;
  case 0x192:
    pcVar19 = "KEY_SRIGHT";
LAB_001e241d:
    lVar11 = 10;
    goto LAB_001e245c;
  case 0x199:
    if (((mouse_capture_enabled == true) && (iVar10 = getmouse(&local_c0), iVar10 == 0)) &&
       (stt_visible == true)) {
      puVar2 = (undefined1 *)((long)&local_c0._M_dataplus._M_p + 4);
      bVar7 = wenclose(stt_win,(int)local_c0._M_string_length,local_c0._M_dataplus._M_p._4_4_);
      if (((byte)((local_c0.field_2._M_allocated_capacity._0_4_ & 2) >> 1) & bVar7) == 1) {
        cVar8 = wmouse_trafo(stt_win,&local_c0._M_string_length,puVar2,0);
        if (cVar8 != '\0') {
          mouse_x = local_c0._M_dataplus._M_p._4_4_;
          mouse_y = (int)local_c0._M_string_length;
          iVar10 = (int)local_c0._M_string_length - uniforms_starts_at;
          if (uniforms_starts_at <= (int)local_c0._M_string_length) goto LAB_001e2572;
        }
      }
      else if ((local_c0.field_2._M_allocated_capacity._0_4_ & 1) != 0) {
        iVar10 = -1;
        if ((-1 < mouse_at) &&
           (cVar8 = wmouse_trafo(stt_win,&local_c0._M_string_length,puVar2,0), iVar3 = mouse_x,
           cVar8 != '\0')) {
          iVar5 = local_c0._M_dataplus._M_p._4_4_;
          local_a0 = (Sandbox *)CONCAT44(local_a0._4_4_,mouse_y);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                    ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
          if (pmVar14->size < 5) {
            local_a0 = (Sandbox *)
                       CONCAT44(local_a0._4_4_,
                                (float)(iVar5 - iVar3) * 0.01 +
                                (float)((int)local_c0._M_string_length - (int)local_a0._0_4_) * 0.1)
            ;
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                      ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
            (pmVar14->value)._M_elems[mouse_at_index] =
                 local_a0._0_4_ + (pmVar14->value)._M_elems[mouse_at_index];
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                      ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
            pmVar14->change = true;
            (*(uniforms->super_Scene)._vptr_Scene[0x3b])();
          }
        }
LAB_001e2572:
        mouse_at = iVar10;
      }
    }
    goto LAB_001e1fa2;
  }
  lVar11 = 8;
LAB_001e245c:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,lVar11);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_001e1fa2:
  refresh_cursor();
LAB_001e1fa7:
  return uVar9 == 0x14f || (uVar9 == 0x157 || uVar9 == 10);
}

Assistant:

bool console_getline(std::string& _cmd, CommandList& _commands, Sandbox& _sandbox) {
    #if defined(SUPPORT_NCURSES)

    if (uniforms == nullptr)
        uniforms = &_sandbox.uniforms;

    suggest(cmd, cmd_suggested, _commands);
    console_refresh();

    int ch = getch();
    cmd_suggested = "";
    if (ch == KEY_STAB || ch == '\t') 
        cmd_tab_counter++;
    else
        cmd_tab_counter = 0;

    if ( ch == '\n' || ch == KEY_ENTER || ch == KEY_EOL) {
        buffer_cout.str("");
        buffer_cerr.str("");
        cmd_history.push_back( cmd );
        cmd_cursor_offset = 0;
        cmd_history_offset = 0;

        _cmd = cmd;
        cmd = "";

        return true;
    }
    else if ( ch == KEY_BACKSPACE || ch == KEY_DC || ch == 127 ) {
        if (cmd.size() > cmd_cursor_offset)
            cmd.erase(cmd.end()-cmd_cursor_offset-1, cmd.end()-cmd_cursor_offset);
    }
    else if ( ch == KEY_STAB || ch == '\t') {
        buffer_cout.str("");
        buffer_cerr.str("");
        if (cmd.size() > 0) {
            if (cmd.find(',') == std::string::npos) {
                std::cout << "Suggestions:\n" << std::endl;
                // cmd_suggested = "";
                std::cout << suggest(cmd, cmd_suggested, _commands);

                if (cmd_tab_counter > 1 && cmd_suggested.size() > 0) {
                    cmd = cmd_suggested;
                    cmd_tab_counter = 0;
                }
                else
                    cmd_suggested = cmd_suggested;
            }
            else {
                std::cout << "Use:" << std::endl;

                for (size_t i = 0; i < _commands.size(); i++)
                    if ( vera::beginsWith(cmd, _commands[i].trigger) )
                        std::cout << "      " << std::left << std::setw(16) << _commands[i].formula << "   " << _commands[i].description << std::endl;

                for (UniformDataMap::iterator it = _sandbox.uniforms.data.begin(); it != _sandbox.uniforms.data.end(); ++it) {
                    if ( vera::beginsWith(cmd, it->first) ) {
                        std::cout << it->first;

                        for (size_t i = 0; it->second.size; i++)
                            std::cout << ",<value>";
                        
                        std::cout << std::endl;
                    }
                }

                std::cout << "\nNotes:" << std::endl;
                std::cout << "      - <values> between <...> brakets need to be change for and actual value" << std::endl;
                std::cout << "      - when words are separated by | you must choose one of the options, like: A|B|C" << std::endl;
                std::cout << "      * everything betwee [...] is optative" << std::endl;
            }
        }
    }
    else if ( ch == KEY_BREAK || ch == ' ') {
        cmd += "_";
    }
    else if ( ch == KEY_LEFT)
        cmd_cursor_offset += cmd_cursor_offset < cmd.size() ? 1 : 0;
    else if ( ch == KEY_RIGHT)
        cmd_cursor_offset = cmd_cursor_offset == 0 ? 0 : cmd_cursor_offset-1;
    else if ( ch == KEY_DOWN ) {
        if (cmd_history.size() > 0 && cmd_history_offset > 0) {
            cmd_history_offset--;
            cmd_cursor_offset = 0;

            if (cmd_history_offset == 0)
                cmd = "";
            else
                cmd = cmd_history[ cmd_history.size() - cmd_history_offset ];
        }
    }
    else if ( ch == KEY_UP ) {
        if (cmd_history_offset < cmd_history.size() - 1)
            cmd_history_offset++;
        cmd_cursor_offset = 0;
        if (cmd_history_offset < cmd_history.size() )
            cmd = cmd_history[ cmd_history.size() - 1 - cmd_history_offset ];
    }
    else if ( ch == KEY_RESIZE)
        console_sigwinch_handler(0);
    else if ( ch == KEY_HOME)
        std::cout << "KEY_HOME" << std::endl;
    else if ( ch == KEY_F0)
        std::cout << "KEY_F0" << std::endl;
    else if ( ch == KEY_DL )
        std::cout << "KEY_DL" << std::endl;
    else if ( ch == KEY_IL )
        std::cout << "KEY_IL" << std::endl;
    else if ( ch == KEY_DC )
        std::cout << "KEY_DC" << std::endl;
    else if ( ch == KEY_IC )
        std::cout << "KEY_IC" << std::endl;
    else if ( ch == KEY_CLEAR)
        std::cout << "KEY_CLEAR" << std::endl;
    else if ( ch == KEY_EOS)
        std::cout << "KEY_EOS" << std::endl;
    else if ( ch == KEY_EOL)
        std::cout << "KEY_EOL" << std::endl;
    else if ( ch == KEY_SF || ch == 339 ) {
        out_offset_line++;
        refresh_out_win();
    }
    else if ( ch == KEY_SR || ch == 338 ) {
        out_offset_line--;
        refresh_out_win();
    }
    else if ( ch == KEY_NPAGE)
        std::cout << "KEY_NPAGE" << std::endl;
    else if ( ch == KEY_PPAGE)
        std::cout << "KEY_PPAGE" << std::endl;
    else if ( ch == KEY_CTAB)
        std::cout << "KEY_CTAB" << std::endl;
    else if ( ch == KEY_BTAB)
        std::cout << "KEY_BTAB" << std::endl;
    else if ( ch == KEY_SRESET)
        std::cout << "KEY_SRESET" << std::endl;
    else if ( ch == KEY_RESET)
        std::cout << "KEY_RESET" << std::endl;
    else if ( ch == KEY_PRINT)
        std::cout << "KEY_PRINT" << std::endl;
    else if ( ch == KEY_LL)
        std::cout << "KEY_LL" << std::endl;
    else if ( ch == KEY_A1)
        std::cout << "KEY_A1" << std::endl;
    else if ( ch == KEY_A3)
        std::cout << "KEY_A3" << std::endl;
    else if ( ch == KEY_B2)
        std::cout << "KEY_B2" << std::endl;
    else if ( ch == KEY_C1)
        std::cout << "KEY_C1" << std::endl;
    else if ( ch == KEY_C3)
        std::cout << "KEY_C3" << std::endl;
    else if ( ch == KEY_BEG)
        std::cout << "KEY_BEG" << std::endl;
    else if ( ch == KEY_CANCEL)
        std::cout << "KEY_CANCEL" << std::endl;
    else if ( ch == KEY_CLOSE)
        std::cout << "KEY_CLOSE" << std::endl;
    else if ( ch == KEY_COMMAND)
        std::cout << "KEY_COMMAND" << std::endl;
    else if ( ch == KEY_COPY)
        std::cout << "KEY_COPY" << std::endl;
    else if ( ch == KEY_CREATE)
        std::cout << "KEY_CREATE" << std::endl;
    else if ( ch == KEY_END)
        std::cout << "KEY_END" << std::endl;
    else if ( ch == KEY_EXIT)
        std::cout << "KEY_EXIT" << std::endl;
    else if ( ch == KEY_FIND)
        std::cout << "KEY_FIND" << std::endl;
    else if ( ch == KEY_HELP)
        std::cout << "KEY_HELP" << std::endl;
    else if ( ch == KEY_MARK)
        std::cout << "KEY_MARK" << std::endl;
    else if ( ch == KEY_MESSAGE)
        std::cout << "KEY_MESSAGE" << std::endl;
    else if ( ch == KEY_MOUSE) {
        if (mouse_capture_enabled) {
            MEVENT m;
            if (getmouse(&m) == OK) {
                if (stt_visible) {
                    if ( wenclose(stt_win, m.y, m.x) && (m.bstate & BUTTON1_PRESSED) ) {
                        if (wmouse_trafo(stt_win, &m.y, &m.x, false) ) {
                            mouse_x = m.x;
                            mouse_y = m.y;
                            if (mouse_y >= uniforms_starts_at)
                                mouse_at = mouse_y - uniforms_starts_at;
                        }
                    }
                    else if ( m.bstate & BUTTON1_RELEASED) {
                        if (mouse_at >= 0) {
                            if (wmouse_trafo(stt_win, &m.y, &m.x, false) ) {
                                float delta = (m.x - mouse_x) * 0.01 + (m.y - mouse_y) * 0.1;
                                if (uniforms->data[mouse_at_key].size < 5) {
                                    uniforms->data[mouse_at_key].value[mouse_at_index] += delta;
                                    uniforms->data[mouse_at_key].change = true;
                                    uniforms->flagChange();
                                }
                            }
                        }
                        mouse_at = -1;
                    }
                }
            }
        }
    }
    else if ( ch == KEY_MOVE)
        std::cout << "KEY_MOVE" << std::endl;
    else if ( ch == KEY_NEXT)
        std::cout << "KEY_NEXT" << std::endl;
    else if ( ch == KEY_OPEN)
        std::cout << "KEY_OPEN" << std::endl;
    else if ( ch == KEY_REDO)
        std::cout << "KEY_REDO" << std::endl;
    else if ( ch == KEY_REFRESH)
        std::cout << "KEY_REFRESH" << std::endl;
    else if ( ch == KEY_RESUME)
        std::cout << "KEY_RESUME" << std::endl;
    else if ( ch == KEY_SLEFT)
        std::cout << "KEY_SLEFT" << std::endl;
    else if ( ch == KEY_SRIGHT)
        std::cout << "KEY_SRIGHT" << std::endl;

    
    // else if ( ch == KEY_END || ch == KEY_EXIT || ch == 27 || ch == EOF) {
    //     keepRunnig = false;
    //     keepRunnig.store(false);
    //     break;
    // }
    else
        cmd.insert(cmd.end() - cmd_cursor_offset, 1, (char)ch );  
      
    refresh_cursor();
    // suggest(cmd, cmd_suggested, _commands);
    #endif

    return false;
}